

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O2

void __thiscall Regular::prepareNextState(Regular *this)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = &this->regularCount;
  *plVar1 = *plVar1 + -1;
  lVar2 = *plVar1;
  if (lVar2 == 0) {
    (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    stochNextValue =
         (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
         stochNextValue + 1.0;
    this->regularCount = this->regularInterval;
  }
  (this->super_StochasticEventGenerator).eventNextValue = lVar2 == 0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  stochNextStateIsPrepared = true;
  return;
}

Assistant:

void Regular::prepareNextState()
{
	regularCount--;
	if (!regularCount) {
		stochNextValue += 1.0;
        eventNextValue = true;
		regularCount = regularInterval;
	}
	else
        eventNextValue = false;
	stochNextStateIsPrepared = true;
}